

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O3

void scep_dump_conf(void)

{
  char *__s;
  char *__s_00;
  char *__s_01;
  long lVar1;
  int flags [22];
  uint local_138 [24];
  char *local_d8 [23];
  
  local_138[0] = c_flag;
  local_138[1] = i_flag;
  local_138[2] = r_flag;
  local_138[3] = d_flag;
  local_138[4] = e_flag;
  local_138[5] = E_flag;
  local_138[6] = F_flag;
  local_138[7] = w_flag;
  local_138[8] = s_flag;
  local_138[9] = l_flag;
  local_138[10] = O_flag;
  local_138[0xb] = n_flag;
  local_138[0xc] = T_flag;
  local_138[0xd] = k_flag;
  local_138[0xe] = K_flag;
  local_138[0xf] = L_flag;
  local_138[0x10] = S_flag;
  local_138[0x11] = p_flag;
  local_138[0x12] = t_flag;
  local_138[0x13] = u_flag;
  local_138[0x14] = v_flag;
  local_138[0x15] = R_flag;
  local_d8[0] = c_char;
  local_d8[1] = i_char;
  local_d8[2] = r_char;
  local_d8[3] = "true";
  local_d8[4] = e_char;
  local_d8[5] = E_char;
  local_d8[6] = F_char;
  local_d8[7] = w_char;
  local_d8[8] = s_char;
  local_d8[9] = l_char;
  local_d8[10] = O_char;
  local_d8[0xd] = k_char;
  local_d8[0xe] = K_char;
  local_d8[0xf] = L_char;
  local_d8[0x10] = S_char;
  local_d8[0x11] = p_char;
  local_d8[0x13] = url_char;
  local_d8[0x14] = "true";
  local_d8[0x15] = "true";
  __s = (char *)malloc(0x14);
  __s_00 = (char *)malloc(0x14);
  __s_01 = (char *)malloc(0x14);
  sprintf(__s,"%d",(ulong)(uint)T_num);
  local_d8[0xc] = __s;
  sprintf(__s_00,"%d",(ulong)(uint)n_num);
  local_d8[0xb] = __s_00;
  sprintf(__s_01,"%d",(ulong)(uint)t_num);
  local_d8[0x12] = __s_01;
  puts("Dumping Configuration");
  lVar1 = 0;
  do {
    if (*(uint *)((long)local_138 + lVar1) != 0) {
      printf("Option: %s, Flag: %i, Value: %s\n",
             (long)&DAT_0011068c + (long)*(int *)((long)&DAT_0011068c + lVar1),
             (ulong)*(uint *)((long)local_138 + lVar1),*(undefined8 *)((long)local_d8 + lVar1 * 2));
    }
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x58);
  exit(0);
}

Assistant:

void scep_dump_conf() {

	char *T_char , *n_char, *t_char;
	int flags[] = {
		c_flag, i_flag, r_flag, d_flag, e_flag, E_flag, F_flag, w_flag, s_flag, l_flag, O_flag, n_flag, T_flag,
		k_flag, K_flag, L_flag, S_flag, p_flag, t_flag, u_flag, v_flag, R_flag
	};
	char *chars[] = {
		c_char, i_char, r_char, "true", e_char, E_char, F_char, w_char, s_char, l_char, O_char, "", "",
		k_char, K_char, L_char, S_char, p_char, "", url_char, "true", "true"
	};
	char *names[] = {
		"-c / CACertFile",
		"-i / CAIdentifier",
		"-r / CertReqFile",
		"-d / Debug",
		"-e / EncCertFile",
		"-E / EncAlgorithm",
		"-F / FingerPrint",
		"-w / GetCertFile or GetCrlFile",
		"-s / GetCertSerial",
		"-l / LocalCertFile",
		"-O / SignCertFile or IssuerCertFile",
		"-n / MaxPollCount",
		"-T / MaxPollTime",
		"-k / PrivateKeyFile",
		"-K / SignKeyFile",
		"-L / SelfSignedFile",
		"-S / SigAlgorithm",
		"-p / Proxy",
		"-t / PollInterval",
		"-u / URL",
		"-v / Verbose",
		"-R / Resume"
	};

	T_char = (char *) malloc(sizeof(char) * 20);
	n_char = (char *) malloc(sizeof(char) * 20);
	t_char = (char *) malloc(sizeof(char) * 20);
	sprintf(T_char, "%d", T_num);
	chars[12] = T_char;
	sprintf(n_char, "%d", n_num);
	chars[11] = n_char;
	sprintf(t_char, "%d", t_num);
	chars[18] = t_char;

	printf("Dumping Configuration\n");

	if(sizeof(chars)/sizeof(char *) == sizeof(names)/sizeof(char *)) {
		int i;
		for(i = 0; i<sizeof(flags)/sizeof(int); i++) {
			if(flags[i])
				printf("Option: %s, Flag: %i, Value: %s\n", names[i], flags[i], chars[i]);
		}
	} else {
		fprintf(stderr, "Length of Arrays does not match! Flags: %zu, Chars: %zu, Names: %zu\n",
			sizeof(flags)/sizeof(int),
			sizeof(chars)/sizeof(char *),
			sizeof(names)/sizeof(char *)
		);
	}
	exit(0);
}